

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODITFReader.cpp
# Opt level: O1

Barcode * __thiscall
ZXing::OneD::ITFReader::decodePattern
          (Barcode *__return_storage_ptr__,ITFReader *this,int rowNumber,PatternView *next,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *param_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  ushort uVar3;
  bool bVar4;
  BarAndSpaceI BVar5;
  char cVar6;
  ushort *puVar7;
  int *piVar8;
  Iterator puVar9;
  ulong uVar10;
  long *plVar11;
  ushort uVar12;
  undefined2 uVar13;
  uint xStart;
  uint uVar14;
  ulong uVar15;
  Iterator puVar16;
  int i_1;
  long lVar17;
  Result *this_00;
  char *pcVar18;
  undefined1 uVar19;
  int iVar20;
  bool bVar21;
  double dVar22;
  anon_class_16_2_7a905435 isGuard;
  BarAndSpaceI threshold;
  string txt;
  BarAndSpace<int> numWide;
  BarAndSpace<int> digits;
  long lStack_c0;
  int local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined1 uStack_ac;
  undefined2 uStack_ab;
  undefined1 uStack_a9;
  undefined7 local_a8;
  undefined1 uStack_a1;
  undefined2 uStack_a0;
  undefined1 uStack_9e;
  undefined5 uStack_9d;
  Result *local_90;
  ITFReader *local_88;
  Error local_80;
  int *local_50;
  long local_48;
  undefined1 local_40 [13];
  undefined2 local_33;
  undefined1 local_31;
  
  isGuard.minQuietZone = 10.0;
  isGuard.pattern = (FixedPattern<4,_4,_false> *)param_3;
  local_88 = this;
  FindLeftGuard<4,ZXing::FindLeftGuard<4,4,false>(ZXing::PatternView_const&,int,ZXing::FixedPattern<4,4,false>const&,double)::_lambda(ZXing::PatternView_const&,int)_1_>
            ((PatternView *)&digits,(ZXing *)next,(PatternView *)&DAT_0000000a,0x199222,isGuard);
  *(int *)&next->_base = local_b8;
  *(undefined4 *)((long)&next->_base + 4) = uStack_b4;
  *(undefined4 *)&next->_end = uStack_b0;
  *(uint *)((long)&next->_end + 4) = CONCAT13(uStack_a9,CONCAT21(uStack_ab,uStack_ac));
  next->_data = (Iterator)digits;
  *(long *)&next->_size = lStack_c0;
  puVar16 = next->_data;
  if (((puVar16 == (Iterator)0x0) || (puVar16 < next->_base)) ||
     (next->_end < puVar16 + next->_size)) {
    memset(__return_storage_ptr__,0,0xd8);
    Result::Result(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  txt._M_dataplus._M_p = (pointer)&txt.field_2;
  txt._M_string_length = 0;
  txt.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&txt);
  puVar16 = next->_data;
  puVar9 = next->_base;
  xStart = 0;
  if (puVar9 != puVar16) {
    uVar12 = 0;
    do {
      uVar12 = uVar12 + *puVar9;
      puVar9 = puVar9 + 1;
    } while (puVar9 != puVar16);
    xStart = (uint)uVar12;
  }
  next->_data = puVar16 + 4;
  next->_size = 10;
  local_90 = __return_storage_ptr__;
  while (((this_00 = local_90, puVar16 = next->_data, puVar16 != (Iterator)0x0 &&
          (next->_base <= puVar16)) && (puVar16 + next->_size <= next->_end))) {
    threshold = RowReader::NarrowWideThreshold(next);
    BVar5 = threshold;
    threshold = BVar5;
    if ((threshold.bar == 0) || (bVar21 = threshold.space == 0, bVar21)) break;
    digits.bar = 0;
    digits.space = 0;
    numWide.bar = 0;
    numWide.space = 0;
    puVar16 = next->_data;
    uVar10 = 0;
    do {
      uVar12 = puVar16[uVar10];
      uVar14 = (uint)uVar10 & 1;
      uVar3 = (&threshold.bar)[uVar14];
      if ((uint)uVar3 + (uint)uVar3 < (uint)uVar12) break;
      iVar20 = 0;
      if (uVar3 < uVar12) {
        iVar20 = *(int *)(&DAT_00199250 + (uVar10 >> 1 & 0x7fffffff) * 4);
      }
      uVar15 = (ulong)(uVar14 << 2);
      piVar8 = (int *)((long)&numWide.bar + uVar15);
      *piVar8 = *piVar8 + (uint)(uVar3 < uVar12);
      piVar8 = (int *)((long)&digits.bar + uVar15);
      *piVar8 = *piVar8 + iVar20;
      uVar10 = uVar10 + 1;
    } while (uVar10 != 10);
    bVar21 = numWide.space != 2;
    bVar4 = numWide.bar != 2;
    this_00 = local_90;
    if (bVar21 || bVar4) break;
    lVar17 = 0;
    do {
      iVar20 = (&digits.bar)[lVar17];
      if (iVar20 == 0xb) {
        iVar20 = 0;
      }
      ToDigit<char>(iVar20);
      std::__cxx11::string::push_back((char)&txt);
      lVar17 = lVar17 + 1;
    } while (lVar17 == 1);
    if (next->_data != (Iterator)0x0) {
      next->_data = next->_data + next->_size;
    }
    this_00 = local_90;
    if (bVar21 || bVar4) break;
  }
  puVar16 = next->_data;
  next->_size = 3;
  if (((int)txt._M_string_length < 6) ||
     (puVar7 = puVar16 + 3,
     next->_end < puVar7 || (puVar16 < next->_base || puVar16 == (Iterator)0x0))) {
LAB_0016427b:
    memset(this_00,0,0xd8);
    Result::Result(this_00);
  }
  else {
    if (puVar7 == next->_end + -1) {
      uVar14 = 0x7fffffff;
    }
    else {
      uVar14 = (uint)*puVar7;
    }
    dVar22 = IsPattern<false,3,4>(next,(FixedPattern<3,_4,_false> *)&STOP_PATTERN_1,uVar14,10.0,0.0)
    ;
    if ((dVar22 == 0.0) && (!NAN(dVar22))) {
      if (next->_data + next->_size == next->_end + -1) {
        uVar14 = 0x7fffffff;
      }
      else {
        uVar14 = (uint)next->_data[next->_size];
      }
      dVar22 = IsPattern<false,3,5>
                         (next,(FixedPattern<3,_5,_false> *)&STOP_PATTERN_2,uVar14,10.0,0.0);
      if ((dVar22 == 0.0) && (!NAN(dVar22))) goto LAB_0016427b;
    }
    if (((undefined1  [12])
         ((undefined1  [12])*(local_88->super_RowReader)._opts & (undefined1  [12])0x80) ==
         (undefined1  [12])0x0) ||
       (cVar6 = GTIN::ComputeCheckDigit<char>(&txt,true),
       cVar6 == txt._M_dataplus._M_p[txt._M_string_length - 1])) {
      piVar8 = &local_b8;
      uStack_9d = 0;
      local_b8 = 0;
      uStack_b4 = 0;
      uStack_b0 = 0;
      uStack_ac = 0;
      uStack_ab = 0;
      uStack_a9 = 0;
      uVar13 = 0xffff;
      plVar11 = &lStack_c0;
      pcVar18 = (char *)0x0;
      uVar19 = 0;
    }
    else {
      piVar8 = (int *)local_40;
      plVar11 = &local_48;
      local_48 = 0;
      local_40[0] = 0;
      local_b8._1_3_ = (uint3)local_40._1_8_;
      local_b8 = (uint)local_b8._1_3_ << 8;
      uStack_b4 = SUB84(local_40._1_8_,3);
      uStack_b0._0_1_ = SUB81(local_40._1_8_,7);
      uStack_b0._1_3_ = (undefined3)local_40._9_4_;
      uStack_ac = SUB41(local_40._9_4_,3);
      uStack_ab = local_33;
      uStack_a9 = local_31;
      uVar19 = 2;
      uVar13 = 0x42;
      pcVar18 = "src/oned/ODITFReader.cpp";
      local_50 = piVar8;
    }
    digits = (BarAndSpace<int>)&local_b8;
    lStack_c0 = 0;
    *plVar11 = 0;
    *(undefined1 *)piVar8 = 0;
    local_a8 = SUB87(pcVar18,0);
    uStack_a1 = 0;
    uStack_a0 = uVar13;
    uStack_9e = uVar19;
    cVar6 = GTIN::ComputeCheckDigit<char>(&txt,true);
    puVar16 = next->_base;
    if (puVar16 == next->_data + next->_size) {
      iVar20 = -1;
    }
    else {
      uVar12 = 0;
      do {
        uVar12 = uVar12 + *puVar16;
        puVar16 = puVar16 + 1;
      } while (puVar16 != next->_data + next->_size);
      iVar20 = uVar12 - 1;
    }
    cVar2 = txt._M_dataplus._M_p[txt._M_string_length - 1];
    paVar1 = &local_80._msg.field_2;
    local_80._msg._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>((string *)&local_80,digits,lStack_c0 + (long)digits);
    local_80._file._0_7_ = local_a8;
    local_80._40_3_ = SUB43(CONCAT13(uStack_9e,CONCAT21(uStack_a0,uStack_a1)) >> 8,0);
    local_80._file._7_1_ = uStack_a1;
    Result::Result(this_00,&txt,rowNumber,xStart,iVar20,ITF,
                   (SymbologyIdentifier)((uint)(cVar6 == cVar2) << 8 | 0x3049),&local_80,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._msg._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._msg._M_dataplus._M_p,local_80._msg.field_2._M_allocated_capacity + 1
                     );
    }
    if (digits != (BarAndSpace<int>)&local_b8) {
      operator_delete((void *)digits,CONCAT44(uStack_b4,local_b8) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)txt._M_dataplus._M_p != &txt.field_2) {
    operator_delete(txt._M_dataplus._M_p,
                    CONCAT71(txt.field_2._M_allocated_capacity._1_7_,txt.field_2._M_local_buf[0]) +
                    1);
  }
  return this_00;
}

Assistant:

Barcode ITFReader::decodePattern(int rowNumber, PatternView& next, std::unique_ptr<DecodingState>&) const
{
	const int minCharCount = 6;
	const int minQuietZone = 10;

	next = FindLeftGuard(next, 4 + minCharCount/2 + 3, START_PATTERN_, minQuietZone);
	if (!next.isValid())
		return {};

	std::string txt;
	txt.reserve(20);

	constexpr int weights[] = {1, 2, 4, 7, 0};
	int xStart = next.pixelsInFront();
	next = next.subView(4, 10);

	while (next.isValid()) {
		const auto threshold = NarrowWideThreshold(next);
		if (!threshold.isValid())
			break;

		BarAndSpace<int> digits, numWide;
		for (int i = 0; i < 10; ++i) {
			if (next[i] > threshold[i] * 2)
				break;
			numWide[i] += next[i] > threshold[i];
			digits[i] += weights[i/2] * (next[i] > threshold[i]);
		}

		if (numWide.bar != 2 || numWide.space != 2)
			break;

		for (int i = 0; i < 2; ++i)
			txt.push_back(ToDigit(digits[i] == 11 ? 0 : digits[i]));

		next.skipSymbol();
	}

	next = next.subView(0, 3);

	if (Size(txt) < minCharCount || !next.isValid())
		return {};

	if (!IsRightGuard(next, STOP_PATTERN_1, minQuietZone) && !IsRightGuard(next, STOP_PATTERN_2, minQuietZone))
		return {};

	Error error = _opts.validateITFCheckSum() && !GTIN::IsCheckDigitValid(txt) ? ChecksumError() : Error();

	// Symbology identifier ISO/IEC 16390:2007 Annex C Table C.1
	// See also GS1 General Specifications 5.1.2 Figure 5.1.2-2
	SymbologyIdentifier symbologyIdentifier = {'I', GTIN::IsCheckDigitValid(txt) ? '1' : '0'};
	
	int xStop = next.pixelsTillEnd();
	return Barcode(txt, rowNumber, xStart, xStop, BarcodeFormat::ITF, symbologyIdentifier, error);
}